

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBitDxEa<(moira::Instr)34,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  bool bVar2;
  uint in_EAX;
  u32 ea;
  uint local_18;
  u32 local_14;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  local_18 = in_EAX;
  bVar2 = readOp<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode & 7,&local_14,&local_18);
  if (bVar2) {
    (this->reg).sr.z = (local_18 >> (uVar1 & 7) & 1) == 0;
    prefetch<4ul>(this);
  }
  return;
}

Assistant:

void
Moira::execBitDxEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    switch (M) {

        case 0:
        {
            u8 b = readD(src) & 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, b);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(b));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            u8 b = readD(src) & 0b111;

            u32 ea, data;
            if (!readOp<M, Byte>(dst, ea, data)) return;

            data = bit<I>(data, b);

            if (I != BTST) {
                prefetch();
                writeM<M, Byte, POLLIPL>(ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}